

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidgetItem::setHidden(QTreeWidgetItem *this,bool hide)

{
  QTreeView *this_00;
  undefined4 row;
  QTreeModel *pQVar1;
  char *__s;
  QWidget *this_01;
  long in_FS_OFFSET;
  QModelIndex local_60;
  undefined1 local_48 [16];
  QTreeWidgetItem *local_38;
  QTreeWidgetItem *local_30;
  
  local_30 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  pQVar1 = treeModel(this,(QTreeWidget *)0x0);
  if (pQVar1 != (QTreeModel *)0x0) {
    if (pQVar1->headerItem == this) {
      this_01 = (QWidget *)QTreeView::header(&this->view->super_QTreeView);
      QWidget::setHidden(this_01,hide);
    }
    else {
      local_38 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      QTreeModel::index((QTreeModel *)local_48,__s,(int)this);
      this_00 = &this->view->super_QTreeView;
      row = local_48._0_4_;
      if (local_38 == (QTreeWidgetItem *)0x0) {
        local_60.r = -1;
        local_60.c = -1;
        local_60.i = 0;
        local_60.m.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (*local_38->_vptr_QTreeWidgetItem[0xd])(&local_60,local_38,local_48);
      }
      QTreeView::setRowHidden(this_00,row,&local_60,hide);
    }
    this->d->field_0x20 = this->d->field_0x20 & 0xfb | hide << 2;
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setHidden(bool hide)
{
    const QTreeModel *model = treeModel();
    if (!model)
        return;
    if (this == model->headerItem) {
        view->header()->setHidden(hide);
    } else {
        const QModelIndex index = view->d_func()->index(this);
        view->setRowHidden(index.row(), index.parent(), hide);
    }
    d->hidden = hide;
}